

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

OP1aHeader * __thiscall
ASDCP::MXF::OP1aHeader::WriteToFile(OP1aHeader *this,FileWriter *Writer,ui32_t HeaderSize)

{
  bool bVar1;
  int iVar2;
  ui32_t uVar3;
  ui32_t uVar4;
  ILogSink *pIVar5;
  PacketList *pPVar6;
  reference ppIVar7;
  byte_t *pbVar8;
  uint *puVar9;
  char *pcVar10;
  uint in_ECX;
  undefined4 in_register_00000014;
  IFileReader *this_00;
  bool bVar11;
  FileWriter *local_570;
  FileWriter *local_548;
  Result_t local_520 [108];
  uint local_4b4;
  undefined1 local_4b0 [4];
  ui32_t write_count_1;
  UL local_448;
  Result_t local_428 [108];
  uint local_3bc;
  undefined1 local_3b8 [4];
  ui32_t klv_fill_length;
  FrameBuffer NilBuf;
  char local_388 [8];
  char intbuf [64];
  fpos_t pos;
  ui32_t local_2d4;
  undefined1 local_2d0 [4];
  ui32_t write_count;
  undefined1 local_268 [112];
  UL TmpUL;
  Result_t local_1d8 [104];
  FrameBuffer local_170 [2];
  undefined1 local_108 [8];
  FrameBuffer WriteWrapper;
  InterchangeObject *object;
  _Self local_d0;
  iterator pl_i;
  Result_t result;
  undefined1 local_50 [8];
  FrameBuffer HeaderBuffer;
  ui32_t HeaderSize_local;
  FileWriter *Writer_local;
  OP1aHeader *this_local;
  
  this_00 = (IFileReader *)CONCAT44(in_register_00000014,HeaderSize);
  if (*(long *)(Writer + 0x78) == 0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x3c5,
                  "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                 );
  }
  if (*(long *)(Writer + 0x210) == 0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
    return this;
  }
  HeaderBuffer.m_PlaintextOffset = in_ECX;
  if (in_ECX < 0x1000) {
    pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (pIVar5,"HeaderSize %u is too small. Must be >= 4096\n",
               (ulong)HeaderBuffer.m_PlaintextOffset);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PARAM);
    return this;
  }
  FrameBuffer::FrameBuffer((FrameBuffer *)local_50);
  uVar4 = HeaderBuffer.m_PlaintextOffset;
  iVar2 = (**(code **)(*(long *)Writer + 0x78))();
  *(ulong *)(Writer + 0xa0) = (ulong)(uVar4 - iVar2);
  if (0xffffffff < *(ulong *)(Writer + 0xa0)) {
    __assert_fail("HeaderByteCount <= 0xFFFFFFFFL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                  ,0x3d1,
                  "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                 );
  }
  FrameBuffer::Capacity((FrameBuffer *)&pl_i,(ui32_t)local_50);
  local_548 = (FileWriter *)0x0;
  if (Writer != (FileWriter *)0xfffffffffffffec0) {
    local_548 = Writer + 0x1b0;
  }
  *(FileWriter **)(*(long *)(Writer + 0x210) + 0x50) = local_548;
  pPVar6 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                     ((mem_ptr<ASDCP::MXF::Partition::PacketList> *)(Writer + 0x70));
  local_d0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
       begin(&pPVar6->m_List);
  while( true ) {
    pPVar6 = mem_ptr<ASDCP::MXF::Partition::PacketList>::operator->
                       ((mem_ptr<ASDCP::MXF::Partition::PacketList> *)(Writer + 0x70));
    object = (InterchangeObject *)
             std::__cxx11::
             list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
             ::end(&pPVar6->m_List);
    bVar1 = std::operator!=(&local_d0,(_Self *)&object);
    bVar11 = false;
    if (bVar1) {
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&pl_i);
      bVar11 = -1 < iVar2;
    }
    if (!bVar11) break;
    ppIVar7 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_d0);
    WriteWrapper._32_8_ = *ppIVar7;
    local_570 = (FileWriter *)0x0;
    if (Writer != (FileWriter *)0xfffffffffffffec0) {
      local_570 = Writer + 0x1b0;
    }
    ((InterchangeObject *)WriteWrapper._32_8_)->m_Lookup = (IPrimerLookup *)local_570;
    FrameBuffer::FrameBuffer((FrameBuffer *)local_108);
    pbVar8 = FrameBuffer::Data((FrameBuffer *)local_50);
    uVar4 = FrameBuffer::Size((FrameBuffer *)local_50);
    FrameBuffer::Capacity((FrameBuffer *)local_50);
    FrameBuffer::Size((FrameBuffer *)local_50);
    FrameBuffer::SetData(local_170,local_108,(int)pbVar8 + uVar4);
    Kumu::Result_t::~Result_t((Result_t *)local_170);
    (**(code **)(*(long *)WriteWrapper._32_8_ + 0x70))(local_1d8,WriteWrapper._32_8_,local_108);
    Kumu::Result_t::operator=((Result_t *)&pl_i,local_1d8);
    Kumu::Result_t::~Result_t(local_1d8);
    uVar4 = FrameBuffer::Size((FrameBuffer *)local_50);
    uVar3 = FrameBuffer::Size((FrameBuffer *)local_108);
    FrameBuffer::Size((FrameBuffer *)local_50,uVar4 + uVar3);
    FrameBuffer::~FrameBuffer((FrameBuffer *)local_108);
    TmpUL.super_Identifier<16U>._24_8_ =
         std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_d0,0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&pl_i);
  if (-1 < iVar2) {
    pbVar8 = Dictionary::ul(*(Dictionary **)(Writer + 0x78),MDD_ClosedCompleteHeader);
    UL::UL((UL *)(local_268 + 0x68),pbVar8);
    Partition::WriteToFile((Partition *)local_268,Writer,(UL *)this_00);
    Kumu::Result_t::operator=((Result_t *)&pl_i,(Result_t *)local_268);
    Kumu::Result_t::~Result_t((Result_t *)local_268);
    UL::~UL((UL *)(local_268 + 0x68));
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&pl_i);
  if (-1 < iVar2) {
    Primer::WriteToFile((Primer *)local_2d0,Writer + 0x140);
    Kumu::Result_t::operator=((Result_t *)&pl_i,(Result_t *)local_2d0);
    Kumu::Result_t::~Result_t((Result_t *)local_2d0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&pl_i);
  if (-1 < iVar2) {
    puVar9 = (uint *)FrameBuffer::RoData((FrameBuffer *)local_50);
    FrameBuffer::Size((FrameBuffer *)local_50);
    Kumu::FileWriter::Write((uchar *)&pos,HeaderSize,puVar9);
    Kumu::Result_t::~Result_t((Result_t *)&pos);
    uVar4 = FrameBuffer::Size((FrameBuffer *)local_50);
    if (local_2d4 != uVar4) {
      __assert_fail("write_count == HeaderBuffer.Size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                    ,0x3ef,
                    "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                   );
    }
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&pl_i);
  if (-1 < iVar2) {
    intbuf._56_8_ = Kumu::IFileReader::TellPosition(this_00);
    if (*(long *)(Writer + 0xa0) < (long)intbuf._56_8_) {
      pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
      pcVar10 = ui64sz(intbuf._56_8_,local_388);
      Kumu::ILogSink::Error
                (pIVar5,"Header size %s exceeds specified value %u\n",pcVar10,
                 (ulong)HeaderBuffer.m_PlaintextOffset);
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
      NilBuf.m_PlaintextOffset = 1;
      goto LAB_0023ce18;
    }
    FrameBuffer::FrameBuffer((FrameBuffer *)local_3b8);
    local_3bc = HeaderBuffer.m_PlaintextOffset - (int)intbuf._56_8_;
    if (local_3bc < 0x14) {
      pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar5,"Remaining region too small for KLV Fill header\n");
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FAIL);
      NilBuf.m_PlaintextOffset = 1;
    }
    else {
      local_3bc = local_3bc - 0x14;
      pbVar8 = Dictionary::ul(*(Dictionary **)(Writer + 0x78),MDD_KLVFill);
      UL::UL(&local_448,pbVar8);
      (**(code **)(*(long *)Writer + 0x60))(local_428,Writer,this_00,&local_448,local_3bc);
      Kumu::Result_t::operator=((Result_t *)&pl_i,local_428);
      Kumu::Result_t::~Result_t(local_428);
      UL::~UL(&local_448);
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&pl_i);
      if (-1 < iVar2) {
        FrameBuffer::Capacity((FrameBuffer *)local_4b0,(ui32_t)local_3b8);
        Kumu::Result_t::operator=((Result_t *)&pl_i,(Result_t *)local_4b0);
        Kumu::Result_t::~Result_t((Result_t *)local_4b0);
      }
      iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)&pl_i);
      if (-1 < iVar2) {
        pbVar8 = FrameBuffer::Data((FrameBuffer *)local_3b8);
        memset(pbVar8,0,(ulong)local_3bc);
        puVar9 = (uint *)FrameBuffer::RoData((FrameBuffer *)local_3b8);
        Kumu::FileWriter::Write((uchar *)local_520,HeaderSize,puVar9);
        Kumu::Result_t::~Result_t(local_520);
        if (local_4b4 != local_3bc) {
          __assert_fail("write_count == klv_fill_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/MXF.cpp"
                        ,0x414,
                        "virtual ASDCP::Result_t ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter &, ui32_t)"
                       );
        }
      }
      NilBuf.m_PlaintextOffset = 0;
    }
    FrameBuffer::~FrameBuffer((FrameBuffer *)local_3b8);
    if (NilBuf.m_PlaintextOffset != 0) goto LAB_0023ce18;
  }
  Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)&pl_i);
  NilBuf.m_PlaintextOffset = 1;
LAB_0023ce18:
  Kumu::Result_t::~Result_t((Result_t *)&pl_i);
  FrameBuffer::~FrameBuffer((FrameBuffer *)local_50);
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::OP1aHeader::WriteToFile(Kumu::FileWriter& Writer, ui32_t HeaderSize)
{
  assert(m_Dict);
  if ( m_Preface == 0 )
    return RESULT_STATE;

  if ( HeaderSize < 4096 ) 
    {
      DefaultLogSink().Error("HeaderSize %u is too small. Must be >= 4096\n", HeaderSize);
      return RESULT_PARAM;
    }

  ASDCP::FrameBuffer HeaderBuffer;
  HeaderByteCount = HeaderSize - ArchiveSize();
  assert (HeaderByteCount <= 0xFFFFFFFFL);
  Result_t result = HeaderBuffer.Capacity((ui32_t) HeaderByteCount); 
  m_Preface->m_Lookup = &m_Primer;

  std::list<InterchangeObject*>::iterator pl_i = m_PacketList->m_List.begin();
  for ( ; pl_i != m_PacketList->m_List.end() && ASDCP_SUCCESS(result); pl_i++ )
    {
      InterchangeObject* object = *pl_i;
      object->m_Lookup = &m_Primer;

      ASDCP::FrameBuffer WriteWrapper;
      WriteWrapper.SetData(HeaderBuffer.Data() + HeaderBuffer.Size(),
			   HeaderBuffer.Capacity() - HeaderBuffer.Size());
      result = object->WriteToBuffer(WriteWrapper);
      HeaderBuffer.Size(HeaderBuffer.Size() + WriteWrapper.Size());
    }

  if ( ASDCP_SUCCESS(result) )
    {
      UL TmpUL(m_Dict->ul(MDD_ClosedCompleteHeader));
      result = Partition::WriteToFile(Writer, TmpUL);
    }

  if ( ASDCP_SUCCESS(result) )
    result = m_Primer.WriteToFile(Writer);

  if ( ASDCP_SUCCESS(result) )
    {
      ui32_t write_count;
      Writer.Write(HeaderBuffer.RoData(), HeaderBuffer.Size(), &write_count);
      assert(write_count == HeaderBuffer.Size());
    }

  // KLV Fill
  if ( ASDCP_SUCCESS(result) )
    {
      Kumu::fpos_t pos = Writer.TellPosition();

      if ( pos > (Kumu::fpos_t)HeaderByteCount )
	{
	  char intbuf[IntBufferLen];
	  DefaultLogSink().Error("Header size %s exceeds specified value %u\n",
				 ui64sz(pos, intbuf),
				 HeaderSize);
	  return RESULT_FAIL;
	}

      ASDCP::FrameBuffer NilBuf;
      ui32_t klv_fill_length = HeaderSize - (ui32_t)pos;

      if ( klv_fill_length < kl_length )
	{
	  DefaultLogSink().Error("Remaining region too small for KLV Fill header\n");
	  return RESULT_FAIL;
	}

      klv_fill_length -= kl_length;
      result = WriteKLToFile(Writer, m_Dict->ul(MDD_KLVFill), klv_fill_length);

      if ( ASDCP_SUCCESS(result) )
	result = NilBuf.Capacity(klv_fill_length);

      if ( ASDCP_SUCCESS(result) )
	{
	  memset(NilBuf.Data(), 0, klv_fill_length);
	  ui32_t write_count;
	  Writer.Write(NilBuf.RoData(), klv_fill_length, &write_count);
	  assert(write_count == klv_fill_length);
	}
    }

  return result;
}